

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator<<(XMLNodeAdapter *node,DataDefinition *dataDefinition)

{
  allocator<char> local_59;
  string local_58;
  Child<const_BSDFData::AngleBasis> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"IncidentDataStructure",&local_59);
  FileParse::Child<const_std::optional<BSDFData::IncidentDataStructure>_>::Child
            ((Child<const_std::optional<BSDFData::IncidentDataStructure>_> *)&local_38,&local_58,
             &dataDefinition->incidentDataStructure,0);
  FileParse::operator<<
            (node,(Child<const_std::optional<BSDFData::IncidentDataStructure>_> *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"AngleBasis",&local_59);
  FileParse::Child<const_BSDFData::AngleBasis>::Child
            (&local_38,&local_58,&dataDefinition->angleBasis,0);
  FileParse::operator<<(node,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Comments",&local_59);
  FileParse::
  Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child((Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_38,&local_58,&dataDefinition->comments,0);
  FileParse::operator<<
            (node,(Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  return node;
}

Assistant:

NodeAdapter & operator<<(NodeAdapter & node, const BSDFData::DataDefinition & dataDefinition)
    {
        node << FileParse::Child{"IncidentDataStructure", dataDefinition.incidentDataStructure};
        node << FileParse::Child{"AngleBasis", dataDefinition.angleBasis};
        node << FileParse::Child{"Comments", dataDefinition.comments};

        return node;
    }